

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O1

bool vkt::pipeline::anon_unknown_0::validateResultImage
               (TestTexture *texture,VkImageViewType imageViewType,
               VkImageSubresourceRange *subresource,Sampler *sampler,
               VkComponentMapping *componentMapping,ConstPixelBufferAccess *coordAccess,
               Vec2 *lodBounds,LookupPrecision *lookupPrecision,Vec4 *lookupScale,Vec4 *lookupBias,
               ConstPixelBufferAccess *resultAccess,PixelBufferAccess *errorAccess)

{
  float *pfVar1;
  pointer pCVar2;
  ConstPixelBufferAccess *pCVar3;
  undefined8 *puVar4;
  int *piVar5;
  deUint32 numLevels;
  float fVar6;
  bool bVar7;
  bool bVar8;
  int i;
  uint uVar9;
  TextureChannelClass TVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  long lVar14;
  TextureCubeView *this;
  Texture3D *this_00;
  Texture1D *pTVar15;
  Texture2D *this_01;
  Texture1DArray *this_02;
  Texture2DArray *this_03;
  TextureCubeArray *pTVar16;
  TextureCube *this_04;
  int faceNdx_1;
  int iVar17;
  int faceNdx;
  int x;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  Vec4 texCoord_7;
  Vec4 resultPixel;
  ConstPixelBufferAccess *local_118;
  ConstPixelBufferAccess *pCStack_110;
  ConstPixelBufferAccess *local_108;
  Vec4 texCoord;
  float local_d8 [4];
  UniquePtr<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> swizzledTex_6;
  UniquePtr<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> swizzledTex;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> levels;
  Vec4 resultColor;
  undefined8 local_68;
  int aiStack_60 [2];
  void *local_58;
  Vec3 local_44;
  float local_38;
  int local_34;
  int x_00;
  
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  levels.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x = (int)resultAccess;
  x_00 = (int)coordAccess;
  switch(imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar20 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar20) {
      lVar23 = 0;
      lVar22 = 0;
      do {
        (*texture->_vptr_TestTexture[8])
                  ((ConstPixelBufferAccess *)&resultPixel,texture,
                   (ulong)(subresource->baseMipLevel + (int)lVar22));
        tcu::getSubregion((ConstPixelBufferAccess *)&resultColor,
                          (ConstPixelBufferAccess *)&resultPixel,0,0,0,(int)resultPixel.m_data[2],1,
                          1);
        *(void **)((long)(&(levels.
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar23) =
             local_58;
        puVar4 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar23 + 8);
        *puVar4 = local_68;
        puVar4[1] = aiStack_60;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar23 + -8);
        *(undefined8 *)pfVar1 = resultColor.m_data._0_8_;
        *(undefined8 *)(pfVar1 + 2) = resultColor.m_data._8_8_;
        lVar22 = lVar22 + 1;
        iVar20 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar23 = lVar23 + 0x28;
      } while (lVar22 < iVar20);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = (TextureCubeView *)operator_new(0x10);
    this->m_numLevels = iVar20;
    this->m_levels[0] = pCVar2;
    bVar7 = isIdentitySwizzle(componentMapping);
    if (bVar7) {
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - lookupBias->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] = texCoord.m_data[lVar22] / lookupScale->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              bVar8 = tcu::isLookupResultValid
                                ((Texture1DView *)this,sampler,lookupPrecision,texCoord.m_data[0],
                                 lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
    }
    else {
      TVar10 = tcu::getTextureChannelClass((this->m_levels[0]->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar10 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar10 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      pCVar3 = this->m_levels[0];
      pTVar15 = (Texture1D *)operator_new(0x50);
      tcu::Texture1D::Texture1D(pTVar15,(TextureFormat *)&resultPixel,(pCVar3->m_size).m_data[0]);
      resultPixel.m_data._0_8_ = pTVar15;
      if (0 < this->m_numLevels) {
        lVar23 = 0;
        lVar22 = 0;
        do {
          tcu::Texture1D::allocLevel(pTVar15,(int)lVar22);
          swizzle((ConstPixelBufferAccess *)((long)(this->m_levels[0]->m_size).m_data + lVar23 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((pTVar15->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar23 + -8),componentMapping);
          lVar22 = lVar22 + 1;
          lVar23 = lVar23 + 0x28;
        } while (lVar22 < this->m_numLevels);
      }
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)resultPixel.m_data._0_8_;
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::reset
                ((UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_> *)&resultPixel);
      pTVar15 = swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                m_data.ptr;
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupScale->m_data[0];
      resultPixel.m_data[2] = 1.0;
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.ptr
           = (TextureCubeArray *)
             CONCAT44(resultPixel.m_data[componentMapping->g],
                      resultPixel.m_data[componentMapping->r]);
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _8_4_ = resultPixel.m_data[componentMapping->b];
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _12_4_ = resultPixel.m_data[componentMapping->a];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupBias->m_data[0];
      resultPixel.m_data[2] = 1.0;
      local_d8[0] = resultPixel.m_data[componentMapping->r];
      local_d8[1] = resultPixel.m_data[componentMapping->g];
      local_d8[2] = resultPixel.m_data[componentMapping->b];
      local_d8[3] = resultPixel.m_data[componentMapping->a];
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - local_d8[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] =
                     texCoord.m_data[lVar22] /
                     *(float *)((long)&swizzledTex_6.
                                       super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                                       .m_data.ptr + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data._8_8_ = (pTVar15->m_view).m_levels;
              texCoord_7.m_data[0] = (float)(pTVar15->m_view).m_numLevels;
              bVar8 = tcu::isLookupResultValid
                                ((Texture1DView *)&texCoord_7,sampler,lookupPrecision,
                                 texCoord.m_data[0],lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
      de::details::UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>::reset
                (&swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>)
      ;
    }
    goto LAB_0051c4d1;
  case VK_IMAGE_VIEW_TYPE_2D:
    plVar13 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2D::typeinfo,0);
    plVar12 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2DArray::typeinfo,0)
    ;
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar20 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar20) {
      lVar23 = 0;
      lVar22 = 0;
      do {
        if (plVar13 == (long *)0x0) {
          lVar14 = (**(code **)(*plVar12 + 0x80))();
        }
        else {
          lVar14 = (**(code **)(*plVar13 + 0x80))(plVar13);
        }
        pCVar3 = (ConstPixelBufferAccess *)
                 (*(long *)(lVar14 + 0x20) +
                 (long)(int)(subresource->baseMipLevel + (int)lVar22) * 0x28);
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar3,0,0,
                          subresource->baseArrayLayer,(pCVar3->m_size).m_data[0],
                          (pCVar3->m_size).m_data[1],1);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar23) = local_108;
        puVar4 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar23 + 8);
        *puVar4 = local_118;
        puVar4[1] = pCStack_110;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar23 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
        lVar22 = lVar22 + 1;
        iVar20 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar23 = lVar23 + 0x28;
      } while (lVar22 < iVar20);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = (TextureCubeView *)operator_new(0x10);
    this->m_numLevels = iVar20;
    this->m_levels[0] = pCVar2;
    bVar7 = isIdentitySwizzle(componentMapping);
    if (bVar7) {
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar8 = true;
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            bVar7 = bVar8;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - lookupBias->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] = texCoord.m_data[lVar22] / lookupScale->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data[0] = texCoord.m_data[0];
              texCoord_7.m_data[1] = texCoord.m_data[1];
              bVar8 = tcu::isLookupResultValid
                                ((Texture2DView *)this,sampler,lookupPrecision,(Vec2 *)&texCoord_7,
                                 lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
              bVar8 = bVar7;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
    }
    else {
      TVar10 = tcu::getTextureChannelClass((this->m_levels[0]->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar10 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar10 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      pCVar3 = this->m_levels[0];
      this_01 = (Texture2D *)operator_new(0x50);
      tcu::Texture2D::Texture2D
                (this_01,(TextureFormat *)&resultPixel,(pCVar3->m_size).m_data[0],
                 (pCVar3->m_size).m_data[1]);
      resultPixel.m_data._0_8_ = this_01;
      if (0 < this->m_numLevels) {
        lVar23 = 0;
        lVar22 = 0;
        do {
          tcu::Texture2D::allocLevel(this_01,(int)lVar22);
          swizzle((ConstPixelBufferAccess *)((long)(this->m_levels[0]->m_size).m_data + lVar23 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((this_01->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar23 + -8),componentMapping);
          lVar22 = lVar22 + 1;
          lVar23 = lVar23 + 0x28;
        } while (lVar22 < this->m_numLevels);
      }
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)resultPixel.m_data._0_8_;
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
                ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&resultPixel);
      pTVar15 = swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                m_data.ptr;
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupScale->m_data[0];
      resultPixel.m_data[2] = 1.0;
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.ptr
           = (TextureCubeArray *)
             CONCAT44(resultPixel.m_data[componentMapping->g],
                      resultPixel.m_data[componentMapping->r]);
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _8_4_ = resultPixel.m_data[componentMapping->b];
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _12_4_ = resultPixel.m_data[componentMapping->a];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupBias->m_data[0];
      resultPixel.m_data[2] = 1.0;
      local_d8[0] = resultPixel.m_data[componentMapping->r];
      local_d8[1] = resultPixel.m_data[componentMapping->g];
      local_d8[2] = resultPixel.m_data[componentMapping->b];
      local_d8[3] = resultPixel.m_data[componentMapping->a];
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - local_d8[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] =
                     texCoord.m_data[lVar22] /
                     *(float *)((long)&swizzledTex_6.
                                       super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                                       .m_data.ptr + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data._8_8_ = (pTVar15->m_view).m_levels;
              texCoord_7.m_data[0] = (float)(pTVar15->m_view).m_numLevels;
              local_44.m_data[0] = texCoord.m_data[0];
              local_44.m_data[1] = texCoord.m_data[1];
              bVar8 = tcu::isLookupResultValid
                                ((Texture2DView *)&texCoord_7,sampler,lookupPrecision,
                                 (Vec2 *)&local_44,lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
      de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset
                ((UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> *)&swizzledTex);
    }
LAB_0051c4d1:
    uVar18 = 0x10;
    goto LAB_0051c897;
  case VK_IMAGE_VIEW_TYPE_3D:
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar20 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar20) {
      lVar23 = 0;
      lVar22 = 0;
      do {
        (*texture->_vptr_TestTexture[8])
                  (&resultPixel,texture,(ulong)(subresource->baseMipLevel + (int)lVar22),
                   (ulong)subresource->baseArrayLayer);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar23) = local_108;
        puVar4 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar23 + 8);
        *puVar4 = local_118;
        puVar4[1] = pCStack_110;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar23 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
        lVar22 = lVar22 + 1;
        iVar20 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar23 = lVar23 + 0x28;
      } while (lVar22 < iVar20);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = (TextureCubeView *)operator_new(0x10);
    tcu::Texture3DView::Texture3DView((Texture3DView *)this,iVar20,pCVar2);
    bVar7 = isIdentitySwizzle(componentMapping);
    if (bVar7) {
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
LAB_0051afd0:
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - lookupBias->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] = texCoord.m_data[lVar22] / lookupScale->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data[0] = texCoord.m_data[0];
              texCoord_7.m_data[1] = texCoord.m_data[1];
              texCoord_7.m_data[2] = texCoord.m_data[2];
              bVar8 = tcu::isLookupResultValid
                                ((Texture3DView *)this,sampler,lookupPrecision,(Vec3 *)&texCoord_7,
                                 lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
    }
    else {
      TVar10 = tcu::getTextureChannelClass((this->m_levels[0]->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar10 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar10 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      pCVar3 = this->m_levels[0];
      this_00 = (Texture3D *)operator_new(0x58);
      tcu::Texture3D::Texture3D
                (this_00,(TextureFormat *)&resultPixel,(pCVar3->m_size).m_data[0],
                 (pCVar3->m_size).m_data[1],(pCVar3->m_size).m_data[2]);
      resultPixel.m_data._0_8_ = this_00;
      if (0 < this->m_numLevels) {
        lVar23 = 0;
        lVar22 = 0;
        do {
          tcu::Texture3D::allocLevel(this_00,(int)lVar22);
          swizzle((ConstPixelBufferAccess *)((long)(this->m_levels[0]->m_size).m_data + lVar23 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((this_00->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar23 + -8),componentMapping);
          lVar22 = lVar22 + 1;
          lVar23 = lVar23 + 0x28;
        } while (lVar22 < this->m_numLevels);
      }
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)resultPixel.m_data._0_8_;
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::reset
                ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&resultPixel);
      pTVar15 = swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                m_data.ptr;
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupScale->m_data[0];
      resultPixel.m_data[2] = 1.0;
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.ptr
           = (TextureCubeArray *)
             CONCAT44(resultPixel.m_data[componentMapping->g],
                      resultPixel.m_data[componentMapping->r]);
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _8_4_ = resultPixel.m_data[componentMapping->b];
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _12_4_ = resultPixel.m_data[componentMapping->a];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupBias->m_data[0];
      resultPixel.m_data[2] = 1.0;
      local_d8[0] = resultPixel.m_data[componentMapping->r];
      local_d8[1] = resultPixel.m_data[componentMapping->g];
      local_d8[2] = resultPixel.m_data[componentMapping->b];
      local_d8[3] = resultPixel.m_data[componentMapping->a];
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - local_d8[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] =
                     texCoord.m_data[lVar22] /
                     *(float *)((long)&swizzledTex_6.
                                       super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                                       .m_data.ptr + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data._8_8_ = pTVar15[1].super_TextureLevelPyramid.m_format;
              texCoord_7.m_data[0] = *(float *)&(pTVar15->m_view).m_levels;
              local_44.m_data[0] = texCoord.m_data[0];
              local_44.m_data[1] = texCoord.m_data[1];
              local_44.m_data[2] = texCoord.m_data[2];
              bVar8 = tcu::isLookupResultValid
                                ((Texture3DView *)&texCoord_7,sampler,lookupPrecision,&local_44,
                                 lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
      de::details::UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_>::reset
                ((UniqueBase<tcu::Texture3D,_de::DefaultDeleter<tcu::Texture3D>_> *)&swizzledTex);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
    plVar13 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCube::typeinfo,0);
    plVar12 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCubeArray::typeinfo,
                                     0);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)(subresource->levelCount * 6));
    lVar22 = 0;
    do {
      if (0 < (int)subresource->levelCount) {
        lVar23 = 0;
        do {
          if (plVar12 == (long *)0x0) {
            lVar14 = (**(code **)(*plVar13 + 0x80))(plVar13);
            plVar11 = (long *)(lVar14 + (ulong)(uint)(&pipeline::(anonymous_namespace)::
                                                                                                              
                                                  getTextureCubeView(vkt::pipeline::TestTexture_const&,vk::VkImageSubresourceRange_const&,std::vector<tcu::ConstPixelBufferAccess,std::allocator<tcu::ConstPixelBufferAccess>>&)
                                                  ::s_faceMap)[lVar22] * 0x18 + 0xa0);
            iVar20 = 0;
            lVar14 = lVar23;
          }
          else {
            lVar14 = (**(code **)(*plVar12 + 0x80))(plVar12);
            plVar11 = (long *)(lVar14 + 0x20);
            lVar14 = (long)(int)(subresource->baseMipLevel + (int)lVar23);
            iVar20 = (int)lVar22;
          }
          pCVar3 = (ConstPixelBufferAccess *)(*plVar11 + lVar14 * 0x28);
          tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar3,0,0,
                            iVar20 + subresource->baseArrayLayer,(pCVar3->m_size).m_data[0],
                            (pCVar3->m_size).m_data[1],1);
          uVar9 = subresource->levelCount * (int)lVar22 + (int)lVar23;
          levels.
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9].m_data = local_108;
          piVar5 = levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].m_size.m_data + 2;
          *(ConstPixelBufferAccess **)piVar5 = local_118;
          *(ConstPixelBufferAccess **)(piVar5 + 2) = pCStack_110;
          pCVar2 = levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar9;
          (pCVar2->m_format).order = (ChannelOrder)resultPixel.m_data[0];
          (pCVar2->m_format).type = (ChannelType)resultPixel.m_data[1];
          *(undefined8 *)(pCVar2->m_size).m_data = resultPixel.m_data._8_8_;
          lVar23 = lVar23 + 1;
        } while (lVar23 < (int)subresource->levelCount);
      }
      pCVar2 = levels.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 1;
    } while (lVar22 != 6);
    numLevels = subresource->levelCount;
    uVar9 = 0;
    lVar22 = 0;
    do {
      *(pointer *)
       (resultPixel.m_data +
       (ulong)*(uint *)((long)&pipeline::(anonymous_namespace)::
                               getTextureCubeView(vkt::pipeline::TestTexture_const&,vk::VkImageSubresourceRange_const&,std::vector<tcu::ConstPixelBufferAccess,std::allocator<tcu::ConstPixelBufferAccess>>&)
                               ::s_faceMap + lVar22) * 2) = pCVar2 + uVar9;
      lVar22 = lVar22 + 4;
      uVar9 = uVar9 + numLevels;
    } while (lVar22 != 0x18);
    this = (TextureCubeView *)operator_new(0x38);
    tcu::TextureCubeView::TextureCubeView
              (this,numLevels,(ConstPixelBufferAccess *(*) [6])&resultPixel);
    bVar7 = isIdentitySwizzle(componentMapping);
    if (bVar7) {
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - lookupBias->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] = texCoord.m_data[lVar22] / lookupScale->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data[0] = texCoord.m_data[0];
              texCoord_7.m_data[1] = texCoord.m_data[1];
              texCoord_7.m_data[2] = texCoord.m_data[2];
              bVar8 = tcu::isLookupResultValid
                                (this,sampler,lookupPrecision,(Vec3 *)&texCoord_7,lodBounds,
                                 &resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
    }
    else {
      this_04 = (TextureCube *)operator_new(0x168);
      TVar10 = tcu::getTextureChannelClass((this->m_levels[0]->m_format).type);
      resultColor.m_data._0_8_ = 0x1d00000008;
      if (TVar10 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultColor.m_data._0_8_ =
             (ulong)(TVar10 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      if (this->m_numLevels < 1) {
        iVar20 = 0;
      }
      else {
        iVar20 = (this->m_levels[0]->m_size).m_data[0];
      }
      tcu::TextureCube::TextureCube(this_04,(TextureFormat *)&resultColor,iVar20);
      lVar22 = 0;
      resultPixel.m_data._0_8_ = this_04;
      do {
        if (0 < this->m_numLevels) {
          lVar14 = 0;
          lVar23 = 0;
          do {
            tcu::TextureCube::allocLevel(this_04,(CubeFace)lVar22,(int)lVar23);
            swizzle((ConstPixelBufferAccess *)
                    ((long)(this->m_levels[lVar22]->m_size).m_data + lVar14 + -8),
                    (PixelBufferAccess *)
                    ((long)((this_04->m_access[lVar22].
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_ConstPixelBufferAccess).m_size.m_data + lVar14 + -8),
                    componentMapping);
            lVar23 = lVar23 + 1;
            lVar14 = lVar14 + 0x28;
          } while (lVar23 < this->m_numLevels);
        }
        swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr
             = (Texture1D *)resultPixel.m_data._0_8_;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 6);
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::reset
                ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&resultPixel
                );
      pTVar15 = swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                m_data.ptr;
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupScale->m_data[0];
      resultPixel.m_data[2] = 1.0;
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.ptr
           = (TextureCubeArray *)
             CONCAT44(resultPixel.m_data[componentMapping->g],
                      resultPixel.m_data[componentMapping->r]);
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _8_4_ = resultPixel.m_data[componentMapping->b];
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _12_4_ = resultPixel.m_data[componentMapping->a];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupBias->m_data[0];
      resultPixel.m_data[2] = 1.0;
      local_d8[0] = resultPixel.m_data[componentMapping->r];
      local_d8[1] = resultPixel.m_data[componentMapping->g];
      local_d8[2] = resultPixel.m_data[componentMapping->b];
      local_d8[3] = resultPixel.m_data[componentMapping->a];
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultColor,x,iVar17,iVar19);
              resultPixel.m_data[0] = 0.0;
              resultPixel.m_data[1] = 0.0;
              resultPixel.m_data[2] = 0.0;
              resultPixel.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultPixel.m_data[lVar22] = resultColor.m_data[lVar22] - local_d8[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] =
                     resultPixel.m_data[lVar22] /
                     *(float *)((long)&swizzledTex_6.
                                       super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                                       .m_data.ptr + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord_7,x_00,iVar17,iVar19);
              resultPixel.m_data[0] = (float)pTVar15[3].m_view.m_numLevels;
              resultPixel.m_data[1] = *(float *)&pTVar15[3].m_view.field_0x4;
              resultPixel.m_data._8_8_ = pTVar15[3].m_view.m_levels;
              local_44.m_data[0] = texCoord_7.m_data[0];
              local_44.m_data[1] = texCoord_7.m_data[1];
              local_44.m_data[2] = texCoord_7.m_data[2];
              bVar8 = tcu::isLookupResultValid
                                ((TextureCubeView *)&resultPixel,sampler,lookupPrecision,&local_44,
                                 lodBounds,&texCoord);
              resultPixel.m_data[1] = 0.0;
              if (bVar8) {
                resultPixel.m_data[0] = 0.0;
                resultPixel.m_data[1] = 1.0;
              }
              else {
                resultPixel.m_data[0] = 1.0;
              }
              resultPixel.m_data[2] = 0.0;
              resultPixel.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&resultPixel,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
      de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::reset
                ((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&swizzledTex
                );
    }
    uVar18 = 0x38;
    goto LAB_0051c897;
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    plVar12 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture1D::typeinfo,0);
    plVar13 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture1DArray::typeinfo,0)
    ;
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar20 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar20) {
      if (plVar12 != (long *)0x0) {
        plVar13 = plVar12;
      }
      lVar23 = 0;
      lVar22 = 0;
      do {
        lVar14 = (**(code **)(*plVar13 + 0x80))(plVar13);
        pCVar3 = (ConstPixelBufferAccess *)
                 (*(long *)(lVar14 + 0x20) +
                 (long)(int)(subresource->baseMipLevel + (int)lVar22) * 0x28);
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar3,0,
                          subresource->baseArrayLayer,0,(pCVar3->m_size).m_data[0],
                          subresource->layerCount,1);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar23) = local_108;
        puVar4 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar23 + 8);
        *puVar4 = local_118;
        puVar4[1] = pCStack_110;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar23 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
        lVar22 = lVar22 + 1;
        iVar20 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar23 = lVar23 + 0x28;
      } while (lVar22 < iVar20);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = (TextureCubeView *)operator_new(0x10);
    tcu::Texture1DArrayView::Texture1DArrayView((Texture1DArrayView *)this,iVar20,pCVar2);
    bVar7 = isIdentitySwizzle(componentMapping);
    if (bVar7) {
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - lookupBias->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] = texCoord.m_data[lVar22] / lookupScale->m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data[0] = texCoord.m_data[0];
              texCoord_7.m_data[1] = texCoord.m_data[1];
              bVar8 = tcu::isLookupResultValid
                                ((Texture1DArrayView *)this,sampler,lookupPrecision,
                                 (Vec2 *)&texCoord_7,lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
    }
    else {
      TVar10 = tcu::getTextureChannelClass((this->m_levels[0]->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar10 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar10 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      pCVar3 = this->m_levels[0];
      this_02 = (Texture1DArray *)operator_new(0x50);
      tcu::Texture1DArray::Texture1DArray
                (this_02,(TextureFormat *)&resultPixel,(pCVar3->m_size).m_data[0],
                 (pCVar3->m_size).m_data[1]);
      resultPixel.m_data._0_8_ = this_02;
      if (0 < this->m_numLevels) {
        lVar23 = 0;
        lVar22 = 0;
        do {
          tcu::Texture1DArray::allocLevel(this_02,(int)lVar22);
          swizzle((ConstPixelBufferAccess *)((long)(this->m_levels[0]->m_size).m_data + lVar23 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((this_02->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar23 + -8),componentMapping);
          lVar22 = lVar22 + 1;
          lVar23 = lVar23 + 0x28;
        } while (lVar22 < this->m_numLevels);
      }
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)resultPixel.m_data._0_8_;
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::reset
                ((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
                 &resultPixel);
      pTVar15 = swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                m_data.ptr;
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupScale->m_data[0];
      resultPixel.m_data[2] = 1.0;
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.ptr
           = (TextureCubeArray *)
             CONCAT44(resultPixel.m_data[componentMapping->g],
                      resultPixel.m_data[componentMapping->r]);
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _8_4_ = resultPixel.m_data[componentMapping->b];
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _12_4_ = resultPixel.m_data[componentMapping->a];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupBias->m_data[0];
      resultPixel.m_data[2] = 1.0;
      local_d8[0] = resultPixel.m_data[componentMapping->r];
      local_d8[1] = resultPixel.m_data[componentMapping->g];
      local_d8[2] = resultPixel.m_data[componentMapping->b];
      local_d8[3] = resultPixel.m_data[componentMapping->a];
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - local_d8[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] =
                     texCoord.m_data[lVar22] /
                     *(float *)((long)&swizzledTex_6.
                                       super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                                       .m_data.ptr + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data._8_8_ = (pTVar15->m_view).m_levels;
              texCoord_7.m_data[0] = (float)(pTVar15->m_view).m_numLevels;
              local_44.m_data[0] = texCoord.m_data[0];
              local_44.m_data[1] = texCoord.m_data[1];
              bVar8 = tcu::isLookupResultValid
                                ((Texture1DArrayView *)&texCoord_7,sampler,lookupPrecision,
                                 (Vec2 *)&local_44,lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
      de::details::UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_>::reset
                ((UniqueBase<tcu::Texture1DArray,_de::DefaultDeleter<tcu::Texture1DArray>_> *)
                 &swizzledTex);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    plVar13 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2D::typeinfo,0);
    plVar12 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTexture2DArray::typeinfo,0)
    ;
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    iVar20 = (int)((ulong)((long)levels.
                                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)levels.
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    if (0 < iVar20) {
      lVar23 = 0;
      lVar22 = 0;
      do {
        if (plVar13 == (long *)0x0) {
          lVar14 = (**(code **)(*plVar12 + 0x80))();
        }
        else {
          lVar14 = (**(code **)(*plVar13 + 0x80))(plVar13);
        }
        pCVar3 = (ConstPixelBufferAccess *)
                 (*(long *)(lVar14 + 0x20) +
                 (long)(int)(subresource->baseMipLevel + (int)lVar22) * 0x28);
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar3,0,0,
                          subresource->baseArrayLayer,(pCVar3->m_size).m_data[0],
                          (pCVar3->m_size).m_data[1],subresource->layerCount);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar23) = local_108;
        puVar4 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar23 + 8);
        *puVar4 = local_118;
        puVar4[1] = pCStack_110;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar23 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
        lVar22 = lVar22 + 1;
        iVar20 = (int)((long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)levels.
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
        lVar23 = lVar23 + 0x28;
      } while (lVar22 < iVar20);
    }
    pCVar2 = levels.
             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = (TextureCubeView *)operator_new(0x10);
    tcu::Texture2DArrayView::Texture2DArrayView((Texture2DArrayView *)this,iVar20,pCVar2);
    bVar7 = isIdentitySwizzle(componentMapping);
    if (bVar7) {
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) goto LAB_0051afd0;
      iVar21 = (resultAccess->m_size).m_data[0];
      bVar7 = true;
      iVar19 = 0;
      do {
        if (0 < iVar21) {
          iVar17 = 0;
          do {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
            texCoord.m_data[0] = 0.0;
            texCoord.m_data[1] = 0.0;
            texCoord.m_data[2] = 0.0;
            texCoord.m_data[3] = 0.0;
            lVar22 = 0;
            do {
              texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - lookupBias->m_data[lVar22];
              lVar22 = lVar22 + 1;
            } while (lVar22 != 4);
            resultColor.m_data[0] = 0.0;
            resultColor.m_data[1] = 0.0;
            resultColor.m_data[2] = 0.0;
            resultColor.m_data[3] = 0.0;
            lVar22 = 0;
            do {
              resultColor.m_data[lVar22] = texCoord.m_data[lVar22] / lookupScale->m_data[lVar22];
              lVar22 = lVar22 + 1;
            } while (lVar22 != 4);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
            texCoord_7.m_data[0] = texCoord.m_data[0];
            texCoord_7.m_data[1] = texCoord.m_data[1];
            texCoord_7.m_data[2] = texCoord.m_data[2];
            bVar8 = tcu::isLookupResultValid
                              ((Texture2DArrayView *)this,sampler,lookupPrecision,
                               (Vec3 *)&texCoord_7,lodBounds,&resultColor);
            texCoord_7.m_data[1] = 0.0;
            if (bVar8) {
              texCoord_7.m_data[0] = 0.0;
              texCoord_7.m_data[1] = 1.0;
            }
            else {
              texCoord_7.m_data[0] = 1.0;
            }
            texCoord_7.m_data[2] = 0.0;
            texCoord_7.m_data[3] = 1.0;
            tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
            if (!bVar8) {
              bVar7 = false;
            }
            iVar17 = iVar17 + 1;
          } while (iVar17 != iVar21);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 != iVar20);
    }
    else {
      TVar10 = tcu::getTextureChannelClass((this->m_levels[0]->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar10 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar10 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      pCVar3 = this->m_levels[0];
      this_03 = (Texture2DArray *)operator_new(0x58);
      tcu::Texture2DArray::Texture2DArray
                (this_03,(TextureFormat *)&resultPixel,(pCVar3->m_size).m_data[0],
                 (pCVar3->m_size).m_data[1],(pCVar3->m_size).m_data[2]);
      resultPixel.m_data._0_8_ = this_03;
      if (0 < this->m_numLevels) {
        lVar23 = 0;
        lVar22 = 0;
        do {
          tcu::Texture2DArray::allocLevel(this_03,(int)lVar22);
          swizzle((ConstPixelBufferAccess *)((long)(this->m_levels[0]->m_size).m_data + lVar23 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((this_03->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar23 + -8),componentMapping);
          lVar22 = lVar22 + 1;
          lVar23 = lVar23 + 0x28;
        } while (lVar22 < this->m_numLevels);
      }
      swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.m_data.ptr =
           (Texture1D *)resultPixel.m_data._0_8_;
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::reset
                ((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                 &resultPixel);
      pTVar15 = swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
                m_data.ptr;
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupScale->m_data[0];
      resultPixel.m_data[2] = 1.0;
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.ptr
           = (TextureCubeArray *)
             CONCAT44(resultPixel.m_data[componentMapping->g],
                      resultPixel.m_data[componentMapping->r]);
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _8_4_ = resultPixel.m_data[componentMapping->b];
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.
      _12_4_ = resultPixel.m_data[componentMapping->a];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupBias->m_data[0];
      resultPixel.m_data[2] = 1.0;
      local_d8[0] = resultPixel.m_data[componentMapping->r];
      local_d8[1] = resultPixel.m_data[componentMapping->g];
      local_d8[2] = resultPixel.m_data[componentMapping->b];
      local_d8[3] = resultPixel.m_data[componentMapping->a];
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) {
        bVar7 = true;
      }
      else {
        iVar21 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar19 = 0;
        do {
          if (0 < iVar21) {
            iVar17 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultPixel,x,iVar17,iVar19);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] - local_d8[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              resultColor.m_data[0] = 0.0;
              resultColor.m_data[1] = 0.0;
              resultColor.m_data[2] = 0.0;
              resultColor.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultColor.m_data[lVar22] =
                     texCoord.m_data[lVar22] /
                     *(float *)((long)&swizzledTex_6.
                                       super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>
                                       .m_data.ptr + lVar22 * 4);
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord,x_00,iVar17,iVar19);
              texCoord_7.m_data._8_8_ = pTVar15[1].super_TextureLevelPyramid.m_format;
              texCoord_7.m_data[0] = *(float *)&(pTVar15->m_view).m_levels;
              local_44.m_data[0] = texCoord.m_data[0];
              local_44.m_data[1] = texCoord.m_data[1];
              local_44.m_data[2] = texCoord.m_data[2];
              bVar8 = tcu::isLookupResultValid
                                ((Texture2DArrayView *)&texCoord_7,sampler,lookupPrecision,&local_44
                                 ,lodBounds,&resultColor);
              texCoord_7.m_data[1] = 0.0;
              if (bVar8) {
                texCoord_7.m_data[0] = 0.0;
                texCoord_7.m_data[1] = 1.0;
              }
              else {
                texCoord_7.m_data[0] = 1.0;
              }
              texCoord_7.m_data[2] = 0.0;
              texCoord_7.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&texCoord_7,iVar17,iVar19,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar21);
          }
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar20);
      }
      de::details::UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_>::reset
                ((UniqueBase<tcu::Texture2DArray,_de::DefaultDeleter<tcu::Texture2DArray>_> *)
                 &swizzledTex);
    }
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    plVar13 = (long *)__dynamic_cast(texture,&TestTexture::typeinfo,&TestTextureCubeArray::typeinfo,
                                     0);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
              (&levels,(ulong)subresource->levelCount);
    if (0 < (int)subresource->levelCount) {
      lVar23 = 0;
      lVar22 = 0;
      do {
        lVar14 = (**(code **)(*plVar13 + 0x80))(plVar13);
        pCVar3 = (ConstPixelBufferAccess *)
                 (*(long *)(lVar14 + 0x20) +
                 (long)(int)(subresource->baseMipLevel + (int)lVar22) * 0x28);
        tcu::getSubregion((ConstPixelBufferAccess *)&resultPixel,pCVar3,0,0,
                          subresource->baseArrayLayer,(pCVar3->m_size).m_data[0],
                          (pCVar3->m_size).m_data[1],subresource->layerCount);
        *(ConstPixelBufferAccess **)
         ((long)(&(levels.
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_pitch + 1) + lVar23) = local_108;
        puVar4 = (undefined8 *)
                 ((long)((levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data + lVar23 + 8);
        *puVar4 = local_118;
        puVar4[1] = pCStack_110;
        pfVar1 = (float *)((long)((levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                          lVar23 + -8);
        *(undefined8 *)pfVar1 = resultPixel.m_data._0_8_;
        *(undefined8 *)(pfVar1 + 2) = resultPixel.m_data._8_8_;
        lVar22 = lVar22 + 1;
        lVar23 = lVar23 + 0x28;
      } while (lVar22 < (int)subresource->levelCount);
    }
    this = (TextureCubeView *)operator_new(0x10);
    tcu::TextureCubeArrayView::TextureCubeArrayView
              ((TextureCubeArrayView *)this,
               (int)((ulong)((long)levels.
                                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)levels.
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
               levels.
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               ._M_impl.super__Vector_impl_data._M_start);
    bVar7 = isIdentitySwizzle(componentMapping);
    if (bVar7) {
      iVar20 = (resultAccess->m_size).m_data[1];
      if (iVar20 < 1) goto LAB_0051afd0;
      iVar21 = (resultAccess->m_size).m_data[0];
      bVar7 = true;
      iVar19 = 0;
      do {
        if (0 < iVar21) {
          iVar17 = 0;
          do {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&resultColor,x,iVar17,iVar19);
            resultPixel.m_data[0] = 0.0;
            resultPixel.m_data[1] = 0.0;
            resultPixel.m_data[2] = 0.0;
            resultPixel.m_data[3] = 0.0;
            lVar22 = 0;
            do {
              resultPixel.m_data[lVar22] = resultColor.m_data[lVar22] - lookupBias->m_data[lVar22];
              lVar22 = lVar22 + 1;
            } while (lVar22 != 4);
            texCoord.m_data[0] = 0.0;
            texCoord.m_data[1] = 0.0;
            texCoord.m_data[2] = 0.0;
            texCoord.m_data[3] = 0.0;
            lVar22 = 0;
            do {
              texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] / lookupScale->m_data[lVar22];
              lVar22 = lVar22 + 1;
            } while (lVar22 != 4);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&texCoord_7,x_00,iVar17,iVar19);
            fVar6 = (float)(lookupPrecision->coordBits).m_data[0];
            lVar22 = 0;
            do {
              resultPixel.m_data[lVar22] = fVar6;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 4);
            bVar8 = tcu::isLookupResultValid
                              ((TextureCubeArrayView *)this,sampler,lookupPrecision,
                               (IVec4 *)&resultPixel,&texCoord_7,lodBounds,&texCoord);
            resultPixel.m_data[1] = 0.0;
            if (bVar8) {
              resultPixel.m_data[0] = 0.0;
              resultPixel.m_data[1] = 1.0;
            }
            else {
              resultPixel.m_data[0] = 1.0;
            }
            resultPixel.m_data[2] = 0.0;
            resultPixel.m_data[3] = 1.0;
            tcu::PixelBufferAccess::setPixel(errorAccess,&resultPixel,iVar17,iVar19,0);
            if (!bVar8) {
              bVar7 = false;
            }
            iVar17 = iVar17 + 1;
          } while (iVar17 != iVar21);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 != iVar20);
    }
    else {
      TVar10 = tcu::getTextureChannelClass((this->m_levels[0]->m_format).type);
      resultPixel.m_data._0_8_ = 0x1d00000008;
      if (TVar10 != TEXTURECHANNELCLASS_SIGNED_INTEGER) {
        resultPixel.m_data._0_8_ =
             (ulong)(TVar10 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) << 0x21 | 0x2100000008;
      }
      pCVar3 = this->m_levels[0];
      pTVar16 = (TextureCubeArray *)operator_new(0x50);
      tcu::TextureCubeArray::TextureCubeArray
                (pTVar16,(TextureFormat *)&resultPixel,(pCVar3->m_size).m_data[0],
                 (pCVar3->m_size).m_data[2]);
      resultPixel.m_data._0_8_ = pTVar16;
      if (0 < this->m_numLevels) {
        lVar23 = 0;
        lVar22 = 0;
        do {
          tcu::TextureCubeArray::allocLevel(pTVar16,(int)lVar22);
          swizzle((ConstPixelBufferAccess *)((long)(this->m_levels[0]->m_size).m_data + lVar23 + -8)
                  ,(PixelBufferAccess *)
                   ((long)(((pTVar16->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess
                          ).m_size.m_data + lVar23 + -8),componentMapping);
          lVar22 = lVar22 + 1;
          lVar23 = lVar23 + 0x28;
        } while (lVar22 < this->m_numLevels);
      }
      swizzledTex_6.
      super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.m_data.ptr
           = (TextureCubeArray *)resultPixel.m_data._0_8_;
      resultPixel.m_data[0] = 0.0;
      resultPixel.m_data[1] = 0.0;
      de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
      reset((UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_> *)
            &resultPixel);
      pTVar16 = swizzledTex_6.
                super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>.
                m_data.ptr;
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupScale->m_data[0];
      resultPixel.m_data[2] = 1.0;
      local_d8[0] = resultPixel.m_data[componentMapping->r];
      local_d8[1] = resultPixel.m_data[componentMapping->g];
      local_d8[2] = resultPixel.m_data[componentMapping->b];
      local_d8[3] = resultPixel.m_data[componentMapping->a];
      resultPixel.m_data[0] = 1.0;
      resultPixel.m_data[1] = 1.0;
      resultPixel.m_data[3] = lookupBias->m_data[0];
      resultPixel.m_data[2] = 1.0;
      local_44.m_data[2] = resultPixel.m_data[componentMapping->b];
      local_38 = resultPixel.m_data[componentMapping->a];
      local_44.m_data[1] = resultPixel.m_data[componentMapping->g];
      local_44.m_data[0] = resultPixel.m_data[componentMapping->r];
      local_34 = (resultAccess->m_size).m_data[1];
      if (local_34 < 1) {
        bVar7 = true;
      }
      else {
        iVar20 = (resultAccess->m_size).m_data[0];
        bVar7 = true;
        iVar21 = 0;
        do {
          if (0 < iVar20) {
            iVar19 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&resultColor,x,iVar19,iVar21);
              resultPixel.m_data[0] = 0.0;
              resultPixel.m_data[1] = 0.0;
              resultPixel.m_data[2] = 0.0;
              resultPixel.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                resultPixel.m_data[lVar22] = resultColor.m_data[lVar22] - local_44.m_data[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              texCoord.m_data[0] = 0.0;
              texCoord.m_data[1] = 0.0;
              texCoord.m_data[2] = 0.0;
              texCoord.m_data[3] = 0.0;
              lVar22 = 0;
              do {
                texCoord.m_data[lVar22] = resultPixel.m_data[lVar22] / local_d8[lVar22];
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&texCoord_7,x_00,iVar19,iVar21);
              swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
              m_data._8_8_ = (pTVar16->m_view).m_levels;
              swizzledTex.super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>.
              m_data.ptr = (Texture1D *)
                           CONCAT44(swizzledTex.
                                    super_UniqueBase<tcu::Texture1D,_de::DefaultDeleter<tcu::Texture1D>_>
                                    .m_data.ptr._4_4_,(pTVar16->m_view).m_numLevels);
              fVar6 = (float)(lookupPrecision->coordBits).m_data[0];
              lVar22 = 0;
              do {
                resultPixel.m_data[lVar22] = fVar6;
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              bVar8 = tcu::isLookupResultValid
                                ((TextureCubeArrayView *)&swizzledTex,sampler,lookupPrecision,
                                 (IVec4 *)&resultPixel,&texCoord_7,lodBounds,&texCoord);
              resultPixel.m_data[1] = 0.0;
              if (bVar8) {
                resultPixel.m_data[0] = 0.0;
                resultPixel.m_data[1] = 1.0;
              }
              else {
                resultPixel.m_data[0] = 1.0;
              }
              resultPixel.m_data[2] = 0.0;
              resultPixel.m_data[3] = 1.0;
              tcu::PixelBufferAccess::setPixel(errorAccess,&resultPixel,iVar19,iVar21,0);
              if (!bVar8) {
                bVar7 = false;
              }
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar20);
          }
          iVar21 = iVar21 + 1;
        } while (iVar21 != local_34);
      }
      de::details::UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>::
      reset(&swizzledTex_6.
             super_UniqueBase<tcu::TextureCubeArray,_de::DefaultDeleter<tcu::TextureCubeArray>_>);
    }
    break;
  default:
    bVar7 = false;
    goto LAB_0051c89c;
  }
  uVar18 = 0x10;
LAB_0051c897:
  operator_delete(this,uVar18);
LAB_0051c89c:
  if (levels.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(levels.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)levels.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool validateResultImage (const TestTexture&					texture,
						  const VkImageViewType					imageViewType,
						  const VkImageSubresourceRange&		subresource,
						  const tcu::Sampler&					sampler,
						  const vk::VkComponentMapping&			componentMapping,
						  const tcu::ConstPixelBufferAccess&	coordAccess,
						  const tcu::Vec2&						lodBounds,
						  const tcu::LookupPrecision&			lookupPrecision,
						  const tcu::Vec4&						lookupScale,
						  const tcu::Vec4&						lookupBias,
						  const tcu::ConstPixelBufferAccess&	resultAccess,
						  const tcu::PixelBufferAccess&			errorAccess)
{
	std::vector<tcu::ConstPixelBufferAccess>	levels;

	switch (imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
		{
			UniquePtr<tcu::Texture1DView>			texView(getTexture1DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		{
			UniquePtr<tcu::Texture1DArrayView>		texView(getTexture1DArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_2D:
		{
			UniquePtr<tcu::Texture2DView>			texView(getTexture2DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		{
			UniquePtr<tcu::Texture2DArrayView>		texView(getTexture2DArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_CUBE:
		{
			UniquePtr<tcu::TextureCubeView>			texView(getTextureCubeView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
		{
			UniquePtr<tcu::TextureCubeArrayView>	texView(getTextureCubeArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
			break;
		}

		case VK_IMAGE_VIEW_TYPE_3D:
		{
			UniquePtr<tcu::Texture3DView>			texView(getTexture3DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		default:
			DE_ASSERT(false);
			return false;
	}
}